

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void quicly_request_stop(quicly_stream_t *stream,int err)

{
  if (((stream->stream_id & 0x8000000000000002U) == 2) &&
     ((((uint)stream->stream_id ^ (uint)(stream->conn->super).local.bidi.next_stream_id) & 1) == 0))
  {
    __assert_fail("quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x174b,"void quicly_request_stop(quicly_stream_t *, int)");
  }
  if ((err & 0xffff0000U) != 0x30000) {
    __assert_fail("QUICLY_ERROR_IS_QUIC_APPLICATION(err)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x174c,"void quicly_request_stop(quicly_stream_t *, int)");
  }
  if (((stream->recvstate).eos == 0xffffffffffffffff) &&
     ((stream->_send_aux).stop_sending.sender_state == QUICLY_SENDER_STATE_NONE)) {
    (stream->_send_aux).stop_sending.sender_state = QUICLY_SENDER_STATE_SEND;
    (stream->_send_aux).stop_sending.error_code = (uint16_t)err;
    sched_stream_control(stream);
    return;
  }
  return;
}

Assistant:

void quicly_request_stop(quicly_stream_t *stream, int err)
{
    assert(quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id));
    assert(QUICLY_ERROR_IS_QUIC_APPLICATION(err));

    /* send STOP_SENDING if the incoming side of the stream is still open */
    if (stream->recvstate.eos == UINT64_MAX && stream->_send_aux.stop_sending.sender_state == QUICLY_SENDER_STATE_NONE) {
        stream->_send_aux.stop_sending.sender_state = QUICLY_SENDER_STATE_SEND;
        stream->_send_aux.stop_sending.error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
        sched_stream_control(stream);
    }
}